

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O1

void ngram_fwdtree_deinit(ngram_search_t *ngs)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  iVar2 = ngs->n_tot_frame;
  lVar3 = ps_config_int((ngs->base).config,"frate");
  dVar4 = (double)iVar2 / (double)lVar3;
  dVar1 = (double)(ngs->fwdtree_perf).t_tot_cpu;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,0x1ac,"TOTAL fwdtree %.2f CPU %.3f xRT\n",dVar1,dVar1 / dVar4);
  dVar1 = (double)(ngs->fwdtree_perf).t_tot_elapsed;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
          ,0x1af,"TOTAL fwdtree %.2f wall %.3f xRT\n",dVar1,dVar1 / dVar4);
  reinit_search_tree(ngs);
  deinit_search_tree(ngs);
  ngs->max_nonroot_chan = 0;
  ckd_free_2d(ngs->active_chan_list);
  ngs->active_chan_list = (chan_t ***)0x0;
  ckd_free(ngs->cand_sf);
  ngs->cand_sf = (cand_sf_t *)0x0;
  ckd_free(ngs->bestbp_rc);
  ngs->bestbp_rc = (bestbp_rc_t *)0x0;
  ckd_free(ngs->lastphn_cand);
  ngs->lastphn_cand = (lastphn_cand_t *)0x0;
  return;
}

Assistant:

void
ngram_fwdtree_deinit(ngram_search_t *ngs)
{
    double n_speech = (double)ngs->n_tot_frame
            / ps_config_int(ps_search_config(ngs), "frate");

    E_INFO("TOTAL fwdtree %.2f CPU %.3f xRT\n",
           ngs->fwdtree_perf.t_tot_cpu,
           ngs->fwdtree_perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL fwdtree %.2f wall %.3f xRT\n",
           ngs->fwdtree_perf.t_tot_elapsed,
           ngs->fwdtree_perf.t_tot_elapsed / n_speech);

    /* Reset non-root channels. */
    reinit_search_tree(ngs);
    /* Free the search tree. */
    deinit_search_tree(ngs);
    /* Free other stuff. */
    ngs->max_nonroot_chan = 0;
    ckd_free_2d(ngs->active_chan_list);
    ngs->active_chan_list = NULL;
    ckd_free(ngs->cand_sf);
    ngs->cand_sf = NULL;
    ckd_free(ngs->bestbp_rc);
    ngs->bestbp_rc = NULL;
    ckd_free(ngs->lastphn_cand);
    ngs->lastphn_cand = NULL;
}